

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O2

string * pybind11::type_id<int>(void)

{
  string *in_RDI;
  allocator local_11;
  
  std::__cxx11::string::string
            ((string *)in_RDI,_PyTuple_SetItem + (*_PyTuple_SetItem == '*'),&local_11);
  detail::clean_type_id(in_RDI);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}